

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O2

int cvt2triphone_mmie(acmod_set_t *acmod_set,acmod_id_t *phone,acmod_id_t *l_phone,
                     acmod_id_t *r_phone,char *btw_mark,uint32 n_phone)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  acmod_id_t aVar5;
  uint32 uVar6;
  uint32 uVar7;
  acmod_id_t aVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  uint id;
  word_posn_t wVar13;
  ulong uVar14;
  ulong uVar15;
  word_posn_t local_64;
  
  aVar5 = acmod_set_name2id(acmod_set,"SIL");
  uVar6 = acmod_set_n_multi(acmod_set);
  if (uVar6 == 0) {
    if (cvt2triphone_mmie_spoke_my_peace == '\0') {
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,0x13b,"no multiphones defined, no conversion done\n");
      cvt2triphone_mmie_spoke_my_peace = '\x01';
      fflush(_stderr);
    }
  }
  else {
    uVar6 = acmod_set_has_attrib(acmod_set,*l_phone,"filler");
    if (uVar6 != 0) {
      *l_phone = aVar5;
    }
    uVar6 = acmod_set_has_attrib(acmod_set,*r_phone,"filler");
    if (uVar6 != 0) {
      *r_phone = aVar5;
    }
    uVar14 = (ulong)(n_phone - 1);
    local_64 = WORD_POSN_END;
    uVar1 = 0;
    uVar4 = (uint)(byte)*l_phone;
LAB_001190a4:
    uVar12 = uVar4;
    uVar15 = uVar1;
    if (uVar15 != uVar14) {
      uVar1 = uVar15 + 1;
      uVar3 = phone[uVar15 + 1];
      uVar6 = acmod_set_has_attrib(acmod_set,uVar3 & 0xff,"filler");
      aVar8 = phone[uVar15];
      id = (uint)(byte)aVar8;
      local_64 = btw_posn(btw_mark[uVar15],local_64);
      uVar7 = acmod_set_has_attrib(acmod_set,id,"filler");
      uVar4 = aVar5;
      if (uVar7 == 0) {
        if (uVar6 != 0) {
          uVar3 = aVar5;
        }
        aVar8 = acmod_set_tri2id(acmod_set,(uint)(byte)aVar8,uVar12 & 0xff,uVar3 & 0xff,local_64);
        uVar4 = id;
        if (aVar8 == 0xffffffff) {
          wVar13 = WORD_POSN_BEGIN;
          do {
            if (wVar13 == WORD_POSN_UNDEFINED) goto LAB_001190a4;
            aVar8 = acmod_set_tri2id(acmod_set,id,uVar12 & 0xff,uVar3 & 0xff,wVar13);
            wVar13 = wVar13 + WORD_POSN_END;
          } while (aVar8 == 0xffffffff);
        }
        phone[uVar15] = aVar8;
      }
      goto LAB_001190a4;
    }
    bVar2 = (byte)phone[uVar14];
    aVar5 = *r_phone;
    uVar6 = acmod_set_has_attrib(acmod_set,(uint)bVar2,"filler");
    if (uVar6 == 0) {
      if (btw_mark[uVar14] == '\0') {
        __assert_fail("btw_mark[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                      ,0x17c,
                      "int cvt2triphone_mmie(acmod_set_t *, acmod_id_t *, acmod_id_t *, acmod_id_t *, char *, uint32)"
                     );
      }
      wVar13 = btw_posn(btw_mark[uVar14],local_64);
      aVar8 = acmod_set_tri2id(acmod_set,(uint)bVar2,uVar12 & 0xff,(uint)(byte)aVar5,wVar13);
      if (aVar8 == 0xffffffff) {
        pcVar9 = acmod_set_id2name(acmod_set,(uint)bVar2);
        pcVar10 = acmod_set_id2name(acmod_set,uVar12 & 0xff);
        pcVar11 = acmod_set_id2name(acmod_set,(uint)(byte)aVar5);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x189,"Missing triphone, (%s %s %s %c), left as CI phone",pcVar9,pcVar10,pcVar11,
                (ulong)(uint)(int)"besiu"[wVar13]);
      }
      else {
        phone[uVar14] = aVar8;
      }
    }
  }
  return 0;
}

Assistant:

int
cvt2triphone_mmie(acmod_set_t *acmod_set,
		  acmod_id_t *phone,
		  acmod_id_t *l_phone,
		  acmod_id_t *r_phone,
		  char *btw_mark,
		  uint32 n_phone)
{
  uint32 i;
  ci_acmod_id_t b = (ci_acmod_id_t)NO_ACMOD;
  ci_acmod_id_t l = (ci_acmod_id_t)NO_ACMOD;
  ci_acmod_id_t r = (ci_acmod_id_t)NO_ACMOD;
  acmod_id_t tri_id;
  word_posn_t posn;
  static int spoke_my_peace = FALSE;
  acmod_id_t sil = acmod_set_name2id(acmod_set, "SIL");
  char *word_posn_map = WORD_POSN_CHAR_MAP;

  if (acmod_set_n_multi(acmod_set) == 0) {
    /* nothing to do */
    
    if (!spoke_my_peace) {
      fflush(stdout);
      E_INFO("no multiphones defined, no conversion done\n");
      spoke_my_peace = TRUE;
      fflush(stderr);
    }
    return S3_SUCCESS;
  }
  
  /* if left phone and right phone is filler */
  if (acmod_set_has_attrib(acmod_set, *l_phone, "filler"))
    *l_phone = sil;
  if (acmod_set_has_attrib(acmod_set, *r_phone, "filler"))
    *r_phone = sil;
  
  for (i = 0, l = *l_phone, r = sil, posn = WORD_POSN_END; i < n_phone-1; i++) {
    /* get new right context */
    r = phone[i+1];
    if (acmod_set_has_attrib(acmod_set, r, "filler"))
      r = sil;
    
    b = phone[i];
    
    /* determine between word position {begin|start|single} */
    posn = btw_posn(btw_mark[i], posn);
    
    if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
      tri_id = acmod_set_tri2id(acmod_set,
				b, l, r, posn);
      if (tri_id != NO_ACMOD) {
	/* got good triphone, so replace CI w/ tri */
	phone[i] = tri_id;
      }
      else {
	/* Try to back off to other word positions */
	int j;
	
	for (j = 0; j < N_WORD_POSN; ++j) {
	  tri_id = acmod_set_tri2id(acmod_set,
				    b, l, r, j);
	  if (tri_id != NO_ACMOD) {
	    phone[i] = tri_id;
	    break;
	  }
	}
      }
    }
    else {
      /* phone[i] is a filler phone, so just leave it as is */
      /* Change b to SIL for triphone context purposes */
      b = sil;
    }
    
    /* Set next left context is the current base phone (where filler phones
     * are mapped to SIL) */
    l = b;
  }
  
  b = phone[i];
  r = *r_phone;
  
  /* At this point, b is the right context of
   * the next to last phone.  Typically, this
   * is sil or some other filler phone. */
  
  if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
    
    assert( btw_mark[i] );
    
    posn = btw_posn(btw_mark[i], posn);
    
    tri_id = acmod_set_tri2id(acmod_set,
			      b, l, r, posn);
    if (tri_id != NO_ACMOD)
      phone[i] = tri_id;
    else {
      E_WARN("Missing triphone, (%s %s %s %c), left as CI phone",
	     acmod_set_id2name(acmod_set, b),
	     acmod_set_id2name(acmod_set, l),
	     acmod_set_id2name(acmod_set, r),
	     word_posn_map[(int)posn]);
    }
  }
  
  return S3_SUCCESS;
}